

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_randomnumberutil.cpp
# Opt level: O0

void __thiscall
RandomNumberUtil_GetRandomBytesEmpty_Test::TestBody(RandomNumberUtil_GetRandomBytesEmpty_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_c8;
  Message local_c0;
  unsigned_long local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar_1;
  Message local_90 [3];
  ByteData local_78;
  string local_60;
  undefined1 local_40 [8];
  AssertionResult gtest_ar;
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  int size;
  RandomNumberUtil_GetRandomBytesEmpty_Test *this_local;
  
  cfd::core::RandomNumberUtil::GetRandomBytes
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_,0);
  cfd::core::ByteData::ByteData
            (&local_78,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  cfd::core::ByteData::GetHex_abi_cxx11_(&local_60,&local_78);
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)local_40,"ByteData(bytes).GetHex().c_str()","\"\"",pcVar2,"");
  std::__cxx11::string::~string((string *)&local_60);
  cfd::core::ByteData::~ByteData(&local_78);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    testing::Message::Message(local_90);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_40);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x39,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_90);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_90);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  local_b0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_)
  ;
  local_b8 = 0;
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_a8,"bytes.size()","static_cast<size_t>(size)",&local_b0,
             &local_b8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a8);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_randomnumberutil.cpp"
               ,0x3a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(RandomNumberUtil, GetRandomBytesEmpty) {
  int size = 0;
  std::vector<uint8_t> bytes = RandomNumberUtil::GetRandomBytes(size);
  EXPECT_STREQ(ByteData(bytes).GetHex().c_str(), "");
  EXPECT_EQ(bytes.size(), static_cast<size_t>(size));
}